

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct_tuple_reader
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  t_field *ptVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  pointer pptVar7;
  allocator local_145;
  int local_144;
  ostream *local_140;
  t_struct *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"@Override");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public void read(org.apache.thrift.protocol.TProtocol prot, ");
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar4));
  poVar5 = std::operator<<(poVar5," struct) throws org.apache.thrift.TException {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_140 = out;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,
                           "org.apache.thrift.protocol.TTupleProtocol iprot = (org.apache.thrift.protocol.TTupleProtocol) prot;"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_144 = 0;
  local_138 = tstruct;
  for (; poVar5 = local_140, iVar4 = local_144,
      pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    ptVar3 = *pptVar7;
    eVar2 = ptVar3->req_;
    if (eVar2 - T_OPTIONAL < 2) {
      local_144 = local_144 + 1;
    }
    else if (eVar2 == T_REQUIRED) {
      std::__cxx11::string::string((string *)&local_50,"struct.",(allocator *)&local_130);
      poVar5 = local_140;
      generate_deserialize_field(this,local_140,ptVar3,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      poVar5 = t_generator::indent((t_generator *)this,poVar5);
      poVar5 = std::operator<<(poVar5,"struct.set");
      std::__cxx11::string::string((string *)&local_90,(string *)&(*pptVar7)->name_);
      get_cap_name(&local_130,this,&local_90);
      poVar5 = std::operator<<(poVar5,(string *)&local_130);
      std::__cxx11::string::string((string *)&local_b0,"isSet",&local_145);
      get_cap_name(&local_110,this,&local_b0);
      poVar5 = std::operator<<(poVar5,(string *)&local_110);
      poVar5 = std::operator<<(poVar5,"(true);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      tstruct = local_138;
    }
  }
  if (0 < local_144) {
    poVar6 = t_generator::indent((t_generator *)this,local_140);
    poVar6 = std::operator<<(poVar6,"java.util.BitSet incoming = iprot.readBitSet(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    poVar6 = std::operator<<(poVar6,");");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    pptVar7 = (local_138->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_144 = 0;
    while( true ) {
      if (pptVar7 ==
          (local_138->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      if ((*pptVar7)->req_ - T_OPTIONAL < 2) {
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"if (incoming.get(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_144);
        poVar6 = std::operator<<(poVar6,")) {");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        ptVar3 = *pptVar7;
        std::__cxx11::string::string((string *)&local_d0,"struct.",(allocator *)&local_130);
        generate_deserialize_field(this,poVar5,ptVar3,&local_d0,false);
        std::__cxx11::string::~string((string *)&local_d0);
        poVar5 = t_generator::indent((t_generator *)this,poVar5);
        poVar5 = std::operator<<(poVar5,"struct.set");
        std::__cxx11::string::string((string *)&local_f0,(string *)&(*pptVar7)->name_);
        get_cap_name(&local_130,this,&local_f0);
        poVar5 = std::operator<<(poVar5,(string *)&local_130);
        std::__cxx11::string::string((string *)&local_70,"isSet",&local_145);
        get_cap_name(&local_110,this,&local_70);
        poVar5 = std::operator<<(poVar5,(string *)&local_110);
        poVar5 = std::operator<<(poVar5,"(true);");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_f0);
        poVar5 = local_140;
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar6 = t_generator::indent((t_generator *)this,local_140);
        poVar6 = std::operator<<(poVar6,"}");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        local_144 = local_144 + 1;
      }
      pptVar7 = pptVar7 + 1;
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,poVar5);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_reader(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "public void read(org.apache.thrift.protocol.TProtocol prot, "
              << tstruct->get_name() << " struct) throws org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "org.apache.thrift.protocol.TTupleProtocol iprot = (org.apache.thrift.protocol.TTupleProtocol) prot;" << endl;
  int optional_count = 0;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_OPTIONAL
        || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
      optional_count++;
    }
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      generate_deserialize_field(out, (*f_iter), "struct.", false);
      indent(out) << "struct.set" << get_cap_name((*f_iter)->get_name()) << get_cap_name("isSet")
                  << "(true);" << endl;
    }
  }
  if (optional_count > 0) {
    indent(out) << "java.util.BitSet incoming = iprot.readBitSet(" << optional_count << ");" << endl;
    int i = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (incoming.get(" << i << ")) {" << endl;
        indent_up();
        generate_deserialize_field(out, (*f_iter), "struct.", false);
        indent(out) << "struct.set" << get_cap_name((*f_iter)->get_name()) << get_cap_name("isSet")
                    << "(true);" << endl;
        indent_down();
        indent(out) << "}" << endl;
        i++;
      }
    }
  }
  indent_down();
  indent(out) << "}" << endl;
}